

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool FindCSSSpanEq(Node *node,ctmbstr *s,Bool deprecatedOnly)

{
  uint local_bc;
  TidyTagId local_b8;
  uint i;
  anon_struct_24_3_0b77f594 CSS_SpanEq [6];
  Bool deprecatedOnly_local;
  ctmbstr *s_local;
  Node *node_local;
  
  CSS_SpanEq[5]._20_4_ = deprecatedOnly;
  memcpy(&local_b8,&DAT_001f83f0,0x90);
  local_bc = 0;
  while( true ) {
    if (*(long *)(CSS_SpanEq + local_bc) == 0) {
      return no;
    }
    if ((((CSS_SpanEq[5]._20_4_ == 0) || (*(int *)&CSS_SpanEq[local_bc].CSSeq != 0)) &&
        (node != (Node *)0x0)) &&
       ((node->tag != (Dict *)0x0 && (node->tag->id == (&local_b8)[(ulong)local_bc * 6])))) break;
    local_bc = local_bc + 1;
  }
  *s = *(ctmbstr *)(CSS_SpanEq + local_bc);
  return yes;
}

Assistant:

static
Bool FindCSSSpanEq( Node *node, ctmbstr *s, Bool deprecatedOnly )
{
    struct
    {
        TidyTagId id;
        ctmbstr CSSeq;
        Bool deprecated;
    }
    const CSS_SpanEq[] =
        {
            { TidyTag_B, "font-weight: bold", no },
            { TidyTag_I, "font-style: italic", no },
            { TidyTag_S, "text-decoration: line-through", yes},
            { TidyTag_STRIKE, "text-decoration: line-through", yes},
            { TidyTag_U, "text-decoration: underline", yes},
            { TidyTag_UNKNOWN, NULL, no }
        };
    uint i;

    for (i=0; CSS_SpanEq[i].CSSeq; ++i)
        if ( (!deprecatedOnly || CSS_SpanEq[i].deprecated)
             && TagIsId(node, CSS_SpanEq[i].id) )
        {
            *s = CSS_SpanEq[i].CSSeq;
            return yes;
        }
    return no; 
}